

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

int rw::PluginList::close(int __fd)

{
  long *plVar1;
  uint *puVar2;
  long *plVar3;
  int in_EAX;
  uint *puVar4;
  long *plVar5;
  
  plVar5 = allPlugins;
  if ((long **)allPlugins != &allPlugins) {
    do {
      plVar1 = (long *)*plVar5;
      puVar2 = (uint *)plVar5[-3];
      plVar3 = (long *)plVar5[-1];
      *plVar3 = plVar5[-2];
      *(long **)(plVar5[-2] + 8) = plVar3;
      plVar3 = (long *)plVar5[1];
      *plVar3 = *plVar5;
      *(long **)(*plVar5 + 8) = plVar3;
      (*DAT_00148850)(plVar5 + -0xd);
      puVar4 = puVar2 + 2;
      if (*(uint **)(puVar2 + 2) == puVar4) {
        puVar4 = (uint *)(ulong)puVar2[1];
        *puVar2 = puVar2[1];
      }
      in_EAX = (int)puVar4;
      plVar5 = plVar1;
    } while ((long **)plVar1 != &allPlugins);
  }
  return in_EAX;
}

Assistant:

void
PluginList::close(void)
{
	PluginList *l;
	Plugin *p;
	FORLIST(lnk, allPlugins){
		p = LLLinkGetData(lnk, Plugin, inGlobalList);
		l = p->parentList;
		p->inParentList.remove();
		p->inGlobalList.remove();
		rwFree(p);
		if(l->plugins.isEmpty())
			l->size = l->defaultSize;
	}
	assert(allPlugins.isEmpty());
}